

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructColumnData::GetUpdateStatistics(StructColumnData *this)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  undefined8 uVar2;
  type other;
  reference this_00;
  pointer pCVar3;
  long in_RSI;
  size_type __n;
  BaseStatistics stats;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_c0;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_b8;
  undefined1 local_b0 [40];
  BaseStatistics local_88;
  
  LogicalType::LogicalType((LogicalType *)(local_b0 + 0x10),(LogicalType *)(in_RSI + 0x30));
  BaseStatistics::CreateEmpty(&local_88,(LogicalType *)(local_b0 + 0x10));
  LogicalType::~LogicalType((LogicalType *)(local_b0 + 0x10));
  ColumnData::GetUpdateStatistics((ColumnData *)local_b0);
  if ((BaseStatistics *)local_b0._0_8_ != (BaseStatistics *)0x0) {
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)local_b0);
    BaseStatistics::Merge(&local_88,other);
  }
  local_b0._8_8_ = this;
  if (*(long *)(in_RSI + 0x118) != *(long *)(in_RSI + 0x110)) {
    __n = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                              *)(in_RSI + 0x110),__n);
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_00);
      (*pCVar3->_vptr_ColumnData[0x19])(&local_b8,pCVar3);
      if (local_b8._M_head_impl != (BaseStatistics *)0x0) {
        local_c0._M_head_impl = local_b8._M_head_impl;
        local_b8._M_head_impl = (BaseStatistics *)0x0;
        StructStats::SetChildStats
                  (&local_88,__n,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&local_c0);
        _Var1._M_head_impl = local_c0._M_head_impl;
        if (local_c0._M_head_impl != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics(local_c0._M_head_impl);
          operator_delete(_Var1._M_head_impl);
        }
        _Var1._M_head_impl = local_b8._M_head_impl;
        local_c0._M_head_impl = (BaseStatistics *)0x0;
        if (local_b8._M_head_impl != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics(local_b8._M_head_impl);
          operator_delete(_Var1._M_head_impl);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(*(long *)(in_RSI + 0x118) - *(long *)(in_RSI + 0x110) >> 3));
  }
  uVar2 = local_b0._8_8_;
  BaseStatistics::ToUnique((BaseStatistics *)local_b0._8_8_);
  if ((__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
       )local_b0._0_8_ !=
      (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_b0._0_8_);
    operator_delete((void *)local_b0._0_8_);
  }
  BaseStatistics::~BaseStatistics(&local_88);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         uVar2;
}

Assistant:

unique_ptr<BaseStatistics> StructColumnData::GetUpdateStatistics() {
	// check if any child column has updates
	auto stats = BaseStatistics::CreateEmpty(type);
	auto validity_stats = validity.GetUpdateStatistics();
	if (validity_stats) {
		stats.Merge(*validity_stats);
	}
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto child_stats = sub_columns[i]->GetUpdateStatistics();
		if (child_stats) {
			StructStats::SetChildStats(stats, i, std::move(child_stats));
		}
	}
	return stats.ToUnique();
}